

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (other == this) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x619);
    other_00 = LogMessage::operator<<(&local_50,"CHECK failed: (&other) != (this): ");
    LogFinisher::operator=(&local_51,other_00);
    LogMessage::~LogMessage(&local_50);
  }
  if (other->current_size_ != 0) {
    MergeFromInternal(this,other,0x198676);
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFrom(const RepeatedPtrFieldBase& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ == 0) return;
  MergeFromInternal(
      other, &RepeatedPtrFieldBase::MergeFromInnerLoop<TypeHandler>);
}